

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O0

void __thiscall DictionaryStats::Lookup(DictionaryStats *this,uint depth)

{
  uint depth_local;
  DictionaryStats *this_local;
  
  this->lookupCount = this->lookupCount + 1;
  this->lookupDepthTotal = depth + this->lookupDepthTotal;
  if (depth != 0) {
    this->collisionCount = this->collisionCount + 1;
  }
  if (this->maxLookupDepth < depth) {
    this->maxLookupDepth = depth;
  }
  return;
}

Assistant:

void DictionaryStats::Lookup(uint depth)
{
    // Note, lookup and collision math only works out if depth is 0-based.
    // I.e., depth of 1 means there was 1 collision and the lookup found key at second item in the bucket
    lookupCount += 1;
    lookupDepthTotal += depth;
    if (depth > 0)
        collisionCount += 1;
    if (maxLookupDepth < depth)
        maxLookupDepth = depth;
}